

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O3

void __thiscall xmrig::CudaBackend::setJob(CudaBackend *this,Job *job)

{
  pointer pCVar1;
  bool bVar2;
  int iVar3;
  Config *this_00;
  CudaConfig *this_01;
  Miner *miner;
  CudaBackendPrivate *this_02;
  pointer pCVar4;
  pointer other;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> threads;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> local_48;
  
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  this_01 = Config::cuda(this_00);
  if (this_01->m_enabled == true) {
    CudaBackendPrivate::init(this->d_ptr,(EVP_PKEY_CTX *)this_01);
  }
  iVar3 = (*(this->super_IBackend)._vptr_IBackend[2])(this);
  if ((char)iVar3 == '\0') {
    (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
    return;
  }
  miner = Controller::miner(this->d_ptr->controller);
  CudaConfig::get(&local_48,this_01,miner,&this->d_ptr->devices);
  pCVar4 = (this->d_ptr->threads).
           super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl
           .super__Vector_impl_data._M_start;
  pCVar1 = (this->d_ptr->threads).
           super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if ((pCVar4 == pCVar1) ||
     (other = local_48.
              super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
              _M_impl.super__Vector_impl_data._M_start,
     (long)pCVar1 - (long)pCVar4 !=
     (long)local_48.
           super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl
           .super__Vector_impl_data._M_finish -
     (long)local_48.
           super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl
           .super__Vector_impl_data._M_start)) {
LAB_00168caa:
    if (local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Log::print(WARNING,
                 "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (no suitable configuration found)\x1b[0m",
                 "\x1b[42;1m\x1b[1;37m nv  \x1b[0m");
      (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
    }
    else {
      (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
      this_02 = this->d_ptr;
      pCVar4 = (this_02->threads).
               super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (this_02->threads).
      super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_48.
           super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl
           .super__Vector_impl_data._M_start;
      (this_02->threads).
      super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_48.
           super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl
           .super__Vector_impl_data._M_finish;
      (this_02->threads).
      super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_48.
           super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pCVar4 != (pointer)0x0) {
        operator_delete(pCVar4);
        this_02 = this->d_ptr;
      }
      CudaBackendPrivate::start(this_02,job);
    }
  }
  else {
    do {
      bVar2 = CudaLaunchData::isEqual(pCVar4,other);
      if (!bVar2) goto LAB_00168caa;
      pCVar4 = pCVar4 + 1;
      other = other + 1;
    } while (pCVar4 != pCVar1);
  }
  if (local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void xmrig::CudaBackend::setJob(const Job &job)
{
    const auto &cuda = d_ptr->controller->config()->cuda();
    if (cuda.isEnabled()) {
        d_ptr->init(cuda);
    }

    if (!isEnabled()) {
        return stop();
    }

    auto threads = cuda.get(d_ptr->controller->miner(), d_ptr->devices);
    if (!d_ptr->threads.empty() && d_ptr->threads.size() == threads.size() && std::equal(d_ptr->threads.begin(), d_ptr->threads.end(), threads.begin())) {
        return;
    }

    if (threads.empty()) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (no suitable configuration found)"), tag);

        return stop();
    }

    stop();

    d_ptr->threads = std::move(threads);
    d_ptr->start(job);
}